

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_output_chain.c
# Opt level: O0

ngx_int_t ngx_output_chain_get_buf(ngx_output_chain_ctx_t *ctx,off_t bsize)

{
  short sVar1;
  ngx_buf_t *pnVar2;
  u_char *puVar3;
  short local_40;
  ngx_uint_t recycled;
  ngx_buf_t *in;
  ngx_buf_t *b;
  size_t size;
  off_t bsize_local;
  ngx_output_chain_ctx_t *ctx_local;
  
  b = (ngx_buf_t *)(ctx->bufs).size;
  sVar1 = 1;
  local_40 = 1;
  if ((*(ushort *)&ctx->in->buf->field_0x48 >> 8 & 1) != 0) {
    if (bsize < (long)b) {
      b = (ngx_buf_t *)bsize;
      local_40 = 0;
    }
    else {
      local_40 = sVar1;
      if (((((byte)ctx->field_0x20 >> 1 & 1) == 0) && ((ctx->bufs).num == 1)) &&
         (bsize < (long)((long)&b->pos + ((ulong)b >> 2)))) {
        local_40 = 0;
        b = (ngx_buf_t *)bsize;
      }
    }
  }
  pnVar2 = (ngx_buf_t *)ngx_pcalloc(ctx->pool,0x50);
  if (pnVar2 == (ngx_buf_t *)0x0) {
    ctx_local = (ngx_output_chain_ctx_t *)0xffffffffffffffff;
  }
  else {
    if (((byte)ctx->field_0x20 >> 1 & 1) == 0) {
      puVar3 = (u_char *)ngx_palloc(ctx->pool,(size_t)b);
      pnVar2->start = puVar3;
      if (pnVar2->start == (u_char *)0x0) {
        return -1;
      }
    }
    else {
      puVar3 = (u_char *)ngx_pmemalign(ctx->pool,(size_t)b,ctx->alignment);
      pnVar2->start = puVar3;
      if (pnVar2->start == (u_char *)0x0) {
        return -1;
      }
    }
    pnVar2->pos = pnVar2->start;
    pnVar2->last = pnVar2->start;
    pnVar2->end = (u_char *)((long)&b->pos + (long)pnVar2->last);
    *(ushort *)&pnVar2->field_0x48 = *(ushort *)&pnVar2->field_0x48 & 0xfffe | 1;
    pnVar2->tag = ctx->tag;
    *(ushort *)&pnVar2->field_0x48 = *(ushort *)&pnVar2->field_0x48 & 0xfff7 | local_40 << 3;
    ctx->buf = pnVar2;
    ctx->allocated = ctx->allocated + 1;
    ctx_local = (ngx_output_chain_ctx_t *)0x0;
  }
  return (ngx_int_t)ctx_local;
}

Assistant:

static ngx_int_t
ngx_output_chain_get_buf(ngx_output_chain_ctx_t *ctx, off_t bsize)
{
    size_t       size;
    ngx_buf_t   *b, *in;
    ngx_uint_t   recycled;

    in = ctx->in->buf;
    size = ctx->bufs.size;
    recycled = 1;

    if (in->last_in_chain) {

        if (bsize < (off_t) size) {

            /*
             * allocate a small temp buf for a small last buf
             * or its small last part
             */

            size = (size_t) bsize;
            recycled = 0;

        } else if (!ctx->directio
                   && ctx->bufs.num == 1
                   && (bsize < (off_t) (size + size / 4)))
        {
            /*
             * allocate a temp buf that equals to a last buf,
             * if there is no directio, the last buf size is lesser
             * than 1.25 of bufs.size and the temp buf is single
             */

            size = (size_t) bsize;
            recycled = 0;
        }
    }

    b = ngx_calloc_buf(ctx->pool);
    if (b == NULL) {
        return NGX_ERROR;
    }

    if (ctx->directio) {

        /*
         * allocate block aligned to a disk sector size to enable
         * userland buffer direct usage conjunctly with directio
         */

        b->start = ngx_pmemalign(ctx->pool, size, (size_t) ctx->alignment);
        if (b->start == NULL) {
            return NGX_ERROR;
        }

    } else {
        b->start = ngx_palloc(ctx->pool, size);
        if (b->start == NULL) {
            return NGX_ERROR;
        }
    }

    b->pos = b->start;
    b->last = b->start;
    b->end = b->last + size;
    b->temporary = 1;
    b->tag = ctx->tag;
    b->recycled = recycled;

    ctx->buf = b;
    ctx->allocated++;

    return NGX_OK;
}